

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O0

void __thiscall QLearning::QtableLogic(QLearning *this,int nn,int depth,int breadth)

{
  int iVar1;
  ostream *this_00;
  reference pvVar2;
  reference pvVar3;
  mapped_type *this_01;
  __type _Var4;
  int local_78;
  int j_1;
  allocator<float> local_65;
  value_type_conflict1 local_64;
  undefined1 local_60 [8];
  vector<float,_std::allocator<float>_> value;
  undefined1 local_40 [4];
  int j;
  vector<int,_std::allocator<int>_> key;
  int i;
  int max_index;
  float size;
  int breadth_local;
  int depth_local;
  int nn_local;
  QLearning *this_local;
  
  if (nn == 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"size cannot be 0");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  _Var4 = std::pow<int,int>(nn,depth);
  key.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (int)_Var4;
  for (key.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)key.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage <
      key.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_;
      key.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)key.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage + 1) {
    IndexFromMulti((vector<int,_std::allocator<int>_> *)local_40,this,
                   (int)key.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,nn,depth);
    for (value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < depth;
        value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage._4_4_ + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_40,
                          (long)value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      *pvVar2 = (int)((float)*pvVar2 - (float)(nn / 2));
    }
    local_64 = 0.0;
    std::allocator<float>::allocator(&local_65);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_60,(long)breadth,&local_64,&local_65);
    std::allocator<float>::~allocator(&local_65);
    for (local_78 = 0; local_78 < breadth; local_78 = local_78 + 1) {
      iVar1 = rand();
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_60,(long)local_78);
      *pvVar3 = (float)(iVar1 % 5 + 1);
    }
    this_01 = std::
              map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
              ::operator[](&this->_q_table,(key_type *)local_40);
    std::vector<float,_std::allocator<float>_>::operator=
              (this_01,(vector<float,_std::allocator<float>_> *)local_60);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_60);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  }
  return;
}

Assistant:

void QLearning::QtableLogic(int nn, int depth, int breadth)
{

    if (nn == 0)
    {
        std::cerr << "size cannot be 0" << std::endl;
    }

    float size = nn / 2;
    int max_index = pow(nn, depth);

    for (int i = 0; i < max_index; i++)
    {
        std::vector<int> key = IndexFromMulti(i, nn, depth);
        //change the interval [0,nn) to the interval [-size,size).
        for (int j = 0; j < depth; j++)
            key[j] -= size;

        //Fill in the value
        std::vector<float> value(breadth, 0);
        for (int j = 0; j < breadth; j++)
            value[j] = (rand() % 5) + 1;

        this->_q_table[key] = value;
    }
    //return q_table;
}